

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsnprintf.c
# Opt level: O0

int vsnprintf(char *__s,size_t __maxlen,char *__format,__gnuc_va_list __arg)

{
  __va_list_tag *p_Var1;
  char *rc;
  _PDCLIB_status_t status;
  __va_list_tag *arg_local;
  char *format_local;
  size_t n_local;
  char *s_local;
  
  rc._0_4_ = 0;
  rc._4_4_ = 0;
  status.n = 0;
  status.i = 0;
  status.s = (char *)0x0;
  status.width._0_4_ = 0xffffffff;
  status.prec = 0;
  status._52_4_ = 0;
  status.arg[0].overflow_arg_area = *(void **)((long)__arg + 0x10);
  status.stream = *__arg;
  status.arg[0]._0_8_ = *(undefined8 *)((long)__arg + 8);
  status._0_8_ = __maxlen;
  status.current = (unsigned_long)__s;
  status.arg[0].reg_save_area = __arg;
  p_Var1 = (__va_list_tag *)__format;
  while (arg_local = p_Var1, (char)arg_local->gp_offset != '\0') {
    if (((char)arg_local->gp_offset != '%') ||
       (p_Var1 = (__va_list_tag *)_PDCLIB_print((char *)arg_local,(_PDCLIB_status_t *)&rc),
       p_Var1 == arg_local)) {
      if (status.n < __maxlen) {
        __s[status.n] = (char)arg_local->gp_offset;
      }
      status.n = status.n + 1;
      p_Var1 = (__va_list_tag *)((long)&arg_local->gp_offset + 1);
    }
  }
  if (status.n < __maxlen) {
    __s[status.n] = '\0';
  }
  return (int)status.n;
}

Assistant:

int vsnprintf( char * _PDCLIB_restrict s, size_t n, const char * _PDCLIB_restrict format, _PDCLIB_va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = n;
    status.i = 0;
    status.current = 0;
    status.s = s;
    status.width = 0;
    status.prec = EOF;
    status.stream = NULL;
    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_print( format, &status ) ) == format ) )
        {
            /* No conversion specifier, print verbatim */
            if ( status.i < n )
            {
                s[ status.i ] = *format;
            }

            status.i++;
            format++;
        }
        else
        {
            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    if ( status.i  < n )
    {
        s[ status.i ] = '\0';
    }

    va_end( status.arg );
    return status.i;
}